

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall QPlaceHolderItem::QPlaceHolderItem(QPlaceHolderItem *this,QWidget *w)

{
  long lVar1;
  QArrayData *pQVar2;
  QWidgetData *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long in_FS_OFFSET;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->objectName).d.d = (Data *)0x0;
  (this->objectName).d.ptr = (char16_t *)0x0;
  (this->objectName).d.size = 0;
  (this->topLevelRect).x1 = 0;
  (this->topLevelRect).y1 = 0;
  (this->topLevelRect).x2 = -1;
  (this->topLevelRect).y2 = -1;
  QObject::objectName();
  pQVar2 = &((this->objectName).d.d)->super_QArrayData;
  *(undefined4 *)&(this->objectName).d.d = local_38;
  *(undefined4 *)((long)&(this->objectName).d.d + 4) = uStack_34;
  *(undefined4 *)&(this->objectName).d.ptr = uStack_30;
  *(undefined4 *)((long)&(this->objectName).d.ptr + 4) = uStack_2c;
  (this->objectName).d.size = local_28;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  pQVar3 = w->data;
  this->hidden = (bool)(*(byte *)((long)&pQVar3->widget_attributes + 2) & 1);
  uVar7 = (pQVar3->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1;
  this->window = SUB41(uVar7,0);
  if (uVar7 != 0) {
    iVar4 = (pQVar3->crect).y1.m_i;
    iVar5 = (pQVar3->crect).x2.m_i;
    iVar6 = (pQVar3->crect).y2.m_i;
    (this->topLevelRect).x1.m_i = (pQVar3->crect).x1.m_i;
    (this->topLevelRect).y1.m_i = iVar4;
    (this->topLevelRect).x2.m_i = iVar5;
    (this->topLevelRect).y2.m_i = iVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPlaceHolderItem::QPlaceHolderItem(QWidget *w)
{
    objectName = w->objectName();
    hidden = w->isHidden();
    window = w->isWindow();
    if (window)
        topLevelRect = w->geometry();
}